

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

uint64_t modinv2p64(uint64_t x)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint64_t uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int32_t *in_RSI;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iStack_b4;
  uint uStack_b0;
  secp256k1_modinv32_trans2x2 sStack_a8;
  undefined8 uStack_98;
  secp256k1_modinv32_signed30 sStack_90;
  int iStack_64;
  secp256k1_modinv32_signed30 sStack_60;
  
  if ((x & 1) != 0) {
    uVar5 = 1;
    iVar7 = 6;
    do {
      uVar5 = (2 - uVar5 * x) * uVar5;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    return uVar5;
  }
  modinv2p64_cold_1();
  sStack_90.v[8] = in_RSI[8];
  sStack_90.v._0_8_ = *(undefined8 *)in_RSI;
  sStack_90.v._8_8_ = *(undefined8 *)(in_RSI + 2);
  sStack_90.v._16_8_ = *(undefined8 *)(in_RSI + 4);
  sStack_90.v._24_8_ = *(undefined8 *)(in_RSI + 6);
  sStack_60.v[8] = *(int32_t *)(x + 0x20);
  sStack_60.v._0_8_ = *(undefined8 *)x;
  sStack_60.v._8_8_ = *(undefined8 *)(x + 8);
  sStack_60.v._16_8_ = *(undefined8 *)(x + 0x10);
  sStack_60.v._24_8_ = *(undefined8 *)(x + 0x18);
  uVar11 = 9;
  iVar15 = -1;
  iVar7 = 0;
  uVar16 = 0;
  do {
    uVar13 = 0;
    if ((sStack_60.v[0] | 0xc0000000U) != 0) {
      for (; ((sStack_60.v[0] | 0xc0000000U) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
      }
    }
    sStack_a8.u = 1 << ((byte)uVar13 & 0x1f);
    iVar15 = iVar15 - uVar13;
    uVar16 = ((uint)sStack_90.v[0] >> 2 ^ (uint)sStack_90.v[0] >> 1) & uVar13 ^ uVar16;
    if (uVar13 == 0x1e) {
      iStack_b4 = 1;
      sStack_a8.q = 0;
      sStack_a8.v = 0;
    }
    else {
      uVar8 = sStack_90.v[1] << 0x1e | sStack_90.v[0];
      uVar12 = (uint)(sStack_60.v[1] << 0x1e | sStack_60.v[0]) >> ((byte)uVar13 & 0x1f);
      iVar9 = 0x1e - uVar13;
      iStack_b4 = 1;
      sStack_a8.v = 0;
      sStack_a8.q = 0;
      do {
        iVar17 = sStack_a8.u;
        uVar13 = uVar12;
        iVar14 = sStack_a8.v;
        if (iVar15 < 0) {
          iVar15 = -iVar15;
          uVar16 = uVar16 ^ (uVar8 & uVar12) >> 1;
          iVar17 = sStack_a8.q;
          uVar13 = uVar8;
          uVar8 = uVar12;
          sStack_a8.q = sStack_a8.u;
          iVar14 = iStack_b4;
          iStack_b4 = sStack_a8.v;
        }
        iVar2 = iVar15 + 1;
        if (iVar9 <= iVar15 + 1) {
          iVar2 = iVar9;
        }
        uVar4 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar8 >> 1 & 0x7f] * (char)uVar13) <<
                (-(char)iVar2 & 0x1fU)) >> (-(char)iVar2 & 0x1fU);
        uVar13 = uVar4 * uVar8 + uVar13;
        sStack_a8.q = uVar4 * iVar17 + sStack_a8.q;
        uVar12 = -1 << ((byte)iVar9 & 0x1f) | uVar13;
        uVar1 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        bVar6 = (byte)uVar1;
        uVar12 = uVar13 >> (bVar6 & 0x1f);
        sStack_a8.u = iVar17 << (bVar6 & 0x1f);
        sStack_a8.v = iVar14 << (bVar6 & 0x1f);
        iStack_b4 = uVar4 * iVar14 + iStack_b4;
        iVar15 = iVar15 - uVar1;
        uVar16 = uVar16 ^ (uVar8 >> 2 ^ uVar8 >> 1) & uVar1;
        iVar9 = iVar9 - uVar1;
      } while (iVar9 != 0);
    }
    uVar13 = (uint)uVar11;
    sStack_a8.r = iStack_b4;
    uStack_98 = uVar11;
    secp256k1_modinv32_update_fg_30_var(uVar13,&sStack_90,&sStack_60,&sStack_a8);
    if (sStack_90.v[0] == 1) {
      if (1 < (int)uVar13) {
        uVar8 = 0;
        uVar10 = 1;
        do {
          uVar8 = uVar8 | sStack_90.v[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
        if (uVar8 != 0) goto LAB_0016ee90;
      }
      uStack_b0 = 1 - (uVar16 * 2 & 2);
      bVar3 = false;
    }
    else {
LAB_0016ee90:
      uVar8 = uVar13 - 1;
      if (((int)(uVar13 - 2) < 0 || *(int *)((long)&uStack_98 + (long)(int)uVar13 * 4 + 4) != 0) ||
          (&iStack_64)[(int)uVar13] != 0) {
        uVar8 = uVar13;
      }
      bVar3 = true;
      uVar11 = (ulong)uVar8;
    }
    if (!bVar3) goto LAB_0016eedc;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x32);
  uStack_b0 = 0;
LAB_0016eedc:
  return (ulong)uStack_b0;
}

Assistant:

static uint64_t modinv2p64(uint64_t x) {
    /* If w = 1/x mod 2^(2^L), then w*(2 - w*x) = 1/x mod 2^(2^(L+1)). See
     * Hacker's Delight second edition, Henry S. Warren, Jr., pages 245-247 for
     * why. Start with L=0, for which it is true for every odd x that
     * 1/x=1 mod 2. Iterating 6 times gives us 1/x mod 2^64. */
    int l;
    uint64_t w = 1;
    CHECK(x & 1);
    for (l = 0; l < 6; ++l) w *= (2 - w*x);
    return w;
}